

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

ogg_int64_t ov_pcm_total(OggVorbis_File *vf,int i)

{
  ogg_int64_t oVar1;
  int local_2c;
  OggVorbis_File *pOStack_28;
  int i_1;
  ogg_int64_t acc;
  int i_local;
  OggVorbis_File *vf_local;
  
  if (vf->ready_state < 2) {
    vf_local = (OggVorbis_File *)0xffffffffffffff7d;
  }
  else if ((vf->seekable == 0) || (vf->links <= i)) {
    vf_local = (OggVorbis_File *)0xffffffffffffff7d;
  }
  else if (i < 0) {
    pOStack_28 = (OggVorbis_File *)0x0;
    for (local_2c = 0; local_2c < vf->links; local_2c = local_2c + 1) {
      oVar1 = ov_pcm_total(vf,local_2c);
      pOStack_28 = (OggVorbis_File *)((long)&pOStack_28->datasource + oVar1);
    }
    vf_local = pOStack_28;
  }
  else {
    vf_local = (OggVorbis_File *)vf->pcmlengths[i * 2 + 1];
  }
  return (ogg_int64_t)vf_local;
}

Assistant:

ogg_int64_t ov_pcm_total(OggVorbis_File *vf,int i){
  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable || i>=vf->links)return(OV_EINVAL);
  if(i<0){
    ogg_int64_t acc=0;
    int i;
    for(i=0;i<vf->links;i++)
      acc+=ov_pcm_total(vf,i);
    return(acc);
  }else{
    return(vf->pcmlengths[i*2+1]);
  }
}